

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmFormatterLog::open_log_file(CVmFormatterLog *this,char *fname)

{
  int iVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined4 extraout_var;
  char *in_RSI;
  err_frame_t err_cur__;
  CVmNetFile *nf;
  CVmNetFile *in_stack_fffffffffffffef0;
  CVmFormatterLog *this_00;
  uint local_f8 [2];
  CVmFormatterLog *local_f0;
  CVmNetFile *local_e8;
  __jmp_buf_tag _Stack_e0;
  undefined8 local_18;
  char *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  puVar2 = (undefined8 *)_ZTW11G_err_frame();
  local_f0 = (CVmFormatterLog *)*puVar2;
  plVar3 = (long *)_ZTW11G_err_frame();
  *plVar3 = (long)local_f8;
  local_f8[0] = _setjmp(&_Stack_e0);
  if (local_f8[0] == 0) {
    iVar1 = CVmNetFile::open(local_10,0,0xe,2,"text/plain");
    local_18 = CONCAT44(extraout_var,iVar1);
  }
  if (local_f8[0] == 1) {
    local_f8[0] = 2;
    local_18 = 0;
  }
  this_00 = local_f0;
  puVar2 = (undefined8 *)_ZTW11G_err_frame();
  *puVar2 = this_00;
  if ((local_f8[0] & 0x4001) != 0) {
    puVar2 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar2 & 2) != 0) {
      plVar3 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar3 + 0x10));
    }
    in_stack_fffffffffffffef0 = local_e8;
    plVar3 = (long *)_ZTW11G_err_frame();
    *(CVmNetFile **)(*plVar3 + 0x10) = in_stack_fffffffffffffef0;
    err_rethrow();
  }
  if ((local_f8[0] & 2) != 0) {
    free(local_e8);
  }
  iVar1 = open_log_file(this_00,in_stack_fffffffffffffef0);
  return iVar1;
}

Assistant:

int CVmFormatterLog::open_log_file(VMG_ const char *fname)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(
            vmg_ fname, 0, NETF_NEW, OSFTLOG, "text/plain");
    }